

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlSAXParseMemoryWithData
                    (xmlSAXHandlerPtr sax,char *buffer,int size,int recovery,void *data)

{
  xmlParserCtxtPtr ctxt;
  xmlDocPtr cur;
  
  xmlInitParser();
  ctxt = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    cur = (xmlDocPtr)0x0;
  }
  else {
    if (sax != (xmlSAXHandlerPtr)0x0) {
      if (ctxt->sax != (_xmlSAXHandler *)0x0) {
        (*xmlFree)(ctxt->sax);
      }
      ctxt->sax = sax;
    }
    xmlDetectSAX2(ctxt);
    if (data != (void *)0x0) {
      ctxt->_private = data;
    }
    ctxt->recovery = recovery;
    xmlParseDocument(ctxt);
    cur = ctxt->myDoc;
    if (recovery == 0 && ctxt->wellFormed == 0) {
      xmlFreeDoc(cur);
      ctxt->myDoc = (xmlDocPtr)0x0;
      cur = (xmlDocPtr)0x0;
    }
    if (sax != (xmlSAXHandlerPtr)0x0) {
      ctxt->sax = (_xmlSAXHandler *)0x0;
    }
    xmlFreeParserCtxt(ctxt);
  }
  return cur;
}

Assistant:

xmlDocPtr
xmlSAXParseMemoryWithData(xmlSAXHandlerPtr sax, const char *buffer,
	          int size, int recovery, void *data) {
    xmlDocPtr ret;
    xmlParserCtxtPtr ctxt;

    xmlInitParser();

    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL) return(NULL);
    if (sax != NULL) {
	if (ctxt->sax != NULL)
	    xmlFree(ctxt->sax);
        ctxt->sax = sax;
    }
    xmlDetectSAX2(ctxt);
    if (data!=NULL) {
	ctxt->_private=data;
    }

    ctxt->recovery = recovery;

    xmlParseDocument(ctxt);

    if ((ctxt->wellFormed) || recovery) ret = ctxt->myDoc;
    else {
       ret = NULL;
       xmlFreeDoc(ctxt->myDoc);
       ctxt->myDoc = NULL;
    }
    if (sax != NULL)
	ctxt->sax = NULL;
    xmlFreeParserCtxt(ctxt);

    return(ret);
}